

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflateResetKeep(z_streamp strm)

{
  internal_state *piVar1;
  int iVar2;
  ct_data_s *pcVar3;
  inflate_state *state;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    piVar1->pending = 0;
    strm->total_out = 0;
    strm->total_in = 0;
    strm->msg = (char *)0x0;
    if (*(int *)&piVar1->pending_buf != 0) {
      strm->adler = (long)(int)(*(uint *)&piVar1->pending_buf & 1);
    }
    piVar1->status = 0x3f34;
    *(undefined4 *)&piVar1->field_0xc = 0;
    *(undefined4 *)((long)&piVar1->pending_buf + 4) = 0;
    *(undefined4 *)&piVar1->pending_buf_size = 0xffffffff;
    *(undefined4 *)((long)&piVar1->pending_buf_size + 4) = 0x8000;
    *(undefined8 *)&piVar1->wrap = 0;
    piVar1->crc0[0] = 0;
    piVar1->crc0[1] = 0;
    piVar1->crc0[2] = 0;
    pcVar3 = piVar1->dyn_ltree + 0x10d;
    *(ct_data_s **)(piVar1->crc0 + 0x10) = pcVar3;
    *(ct_data_s **)(piVar1->crc0 + 8) = pcVar3;
    *(ct_data_s **)(piVar1->crc0 + 6) = pcVar3;
    piVar1[1].d_desc.max_code = 1;
    *(undefined4 *)&piVar1[1].d_desc.field_0xc = 0xffffffff;
    strm_local._4_4_ = 0;
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT inflateResetKeep(z_streamp strm) {
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = Z_NULL;
    if (state->wrap)        /* to support ill-conceived Java test suite */
        strm->adler = state->wrap & 1;
    state->mode = HEAD;
    state->last = 0;
    state->havedict = 0;
    state->flags = -1;
    state->dmax = 32768U;
    state->head = Z_NULL;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    state->sane = 1;
    state->back = -1;
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}